

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O0

TPM_RC TPM2_Hash(TSS_DEVICE *tpm,TPM2B_MAX_BUFFER *data,TPMI_ALG_HASH hashAlg,
                TPMI_RH_HIERARCHY hierarchy,TPM2B_DIGEST *outHash,TPMT_TK_HASHCHECK *validation)

{
  UINT16 UVar1;
  TPM_RC TVar2;
  undefined1 local_30e4 [8];
  TPMT_TK_HASHCHECK val;
  void *p_3;
  void *p_2;
  void *p_1;
  void *p;
  BYTE *paramBuf;
  TSS_CMD_CONTEXT *pTStack_3068;
  INT32 sizeParamBuf;
  TSS_CMD_CONTEXT *cmdCtx;
  undefined1 local_3058 [4];
  TPM_RC cmdResult;
  TSS_CMD_CONTEXT CmdCtx;
  TPMT_TK_HASHCHECK *validation_local;
  TPM2B_DIGEST *outHash_local;
  TPMI_RH_HIERARCHY hierarchy_local;
  TPMI_ALG_HASH hashAlg_local;
  TPM2B_MAX_BUFFER *data_local;
  TSS_DEVICE *tpm_local;
  
  cmdCtx._4_4_ = 0;
  pTStack_3068 = (TSS_CMD_CONTEXT *)local_3058;
  paramBuf._4_4_ = 0x1000;
  p = &cmdResult;
  local_3058 = (undefined1  [4])0x0;
  CmdCtx._12312_8_ = validation;
  outHash_local._0_4_ = hierarchy;
  outHash_local._6_2_ = hashAlg;
  _hierarchy_local = data;
  data_local = (TPM2B_MAX_BUFFER *)tpm;
  if (data == (TPM2B_MAX_BUFFER *)0x0) {
    UVar1 = UINT16_Marshal(&NullSize,(BYTE **)&p,(INT32 *)((long)&paramBuf + 4));
    pTStack_3068->ParamSize = (uint)UVar1 + pTStack_3068->ParamSize;
  }
  else {
    UVar1 = TPM2B_MAX_BUFFER_Marshal(data,(BYTE **)&p,(INT32 *)((long)&paramBuf + 4));
    pTStack_3068->ParamSize = (uint)UVar1 + pTStack_3068->ParamSize;
  }
  UVar1 = UINT16_Marshal((UINT16 *)((long)&outHash_local + 6),(BYTE **)&p,
                         (INT32 *)((long)&paramBuf + 4));
  pTStack_3068->ParamSize = (uint)UVar1 + pTStack_3068->ParamSize;
  val._68_8_ = &outHash_local;
  UVar1 = UINT32_Marshal((UINT32 *)&outHash_local,(BYTE **)&p,(INT32 *)((long)&paramBuf + 4));
  pTStack_3068->ParamSize = (uint)UVar1 + pTStack_3068->ParamSize;
  cmdCtx._4_4_ = TSS_DispatchCmd((TSS_DEVICE *)&data_local->t,0x17d,(TPM_HANDLE *)0x0,0,
                                 (TSS_SESSION **)0x0,0,pTStack_3068);
  tpm_local._4_4_ = cmdCtx._4_4_;
  if (cmdCtx._4_4_ == 0) {
    TVar2 = TPM2B_DIGEST_Unmarshal
                      (outHash,&pTStack_3068->RespBufPtr,(INT32 *)&pTStack_3068->RespBytesLeft);
    if (TVar2 == 0) {
      if (CmdCtx._12312_8_ == 0) {
        TVar2 = TPMT_TK_HASHCHECK_Unmarshal
                          ((TPMT_TK_HASHCHECK *)local_30e4,&pTStack_3068->RespBufPtr,
                           (INT32 *)&pTStack_3068->RespBytesLeft);
        if (TVar2 != 0) {
          return 0x9a;
        }
      }
      else {
        TVar2 = TPMT_TK_HASHCHECK_Unmarshal
                          ((TPMT_TK_HASHCHECK *)CmdCtx._12312_8_,&pTStack_3068->RespBufPtr,
                           (INT32 *)&pTStack_3068->RespBytesLeft);
        if (TVar2 != 0) {
          return 0x9a;
        }
      }
      tpm_local._4_4_ = cmdCtx._4_4_;
    }
    else {
      tpm_local._4_4_ = 0x9a;
    }
  }
  return tpm_local._4_4_;
}

Assistant:

TPM_RC
TPM2_Hash(
    TSS_DEVICE             *tpm,                // IN/OUT
    TPM2B_MAX_BUFFER       *data,               // IN
    TPMI_ALG_HASH           hashAlg,            // IN
    TPMI_RH_HIERARCHY       hierarchy,          // IN [opt]
    TPM2B_DIGEST           *outHash,            // OUT
    TPMT_TK_HASHCHECK      *validation          // OUT [opt]
)
{
    TSS_CMD_CONTEXT  CmdCtx;

    BEGIN_CMD();
    TSS_MARSHAL_OPT2B(TPM2B_MAX_BUFFER, data);
    TSS_MARSHAL(TPMI_ALG_HASH, &hashAlg);
    TSS_MARSHAL(TPMI_RH_HIERARCHY, &hierarchy);
    DISPATCH_CMD(Hash, NULL, 0, NULL, 0);
    TSS_UNMARSHAL(TPM2B_DIGEST, outHash);
    TSS_UNMARSHAL_OPT(TPMT_TK_HASHCHECK, validation);
    END_CMD();
}